

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_long,unsigned_long,duckdb::Equals,false,true>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long uVar4;
  sel_t *psVar5;
  idx_t iVar6;
  sel_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  bool bVar16;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    uVar15 = count + 0x3f;
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar15 < 0x40) {
        lVar8 = 0;
      }
      else {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar8 = 0;
        uVar13 = 0;
        uVar10 = 0;
        do {
          if (puVar1 == (unsigned_long *)0x0) {
            uVar14 = 0xffffffffffffffff;
          }
          else {
            uVar14 = puVar1[uVar13];
          }
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
          uVar9 = uVar10;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar10 < uVar12) {
              psVar2 = sel->sel_vector;
              uVar14 = *rdata;
              psVar3 = false_sel->sel_vector;
              do {
                uVar9 = uVar10;
                if (psVar2 != (sel_t *)0x0) {
                  uVar9 = (ulong)psVar2[uVar10];
                }
                uVar4 = ldata[uVar10];
                psVar3[lVar8] = (sel_t)uVar9;
                lVar8 = lVar8 + (ulong)(uVar4 != uVar14);
                uVar10 = uVar10 + 1;
                uVar9 = uVar10;
              } while (uVar12 != uVar10);
            }
          }
          else if (uVar14 == 0) {
            uVar9 = uVar12;
            if (uVar10 < uVar12) {
              psVar2 = sel->sel_vector;
              psVar3 = false_sel->sel_vector;
              do {
                sVar7 = (sel_t)uVar10;
                if (psVar2 != (sel_t *)0x0) {
                  sVar7 = psVar2[uVar10];
                }
                psVar3[lVar8] = sVar7;
                lVar8 = lVar8 + 1;
                uVar10 = uVar10 + 1;
              } while (uVar12 != uVar10);
            }
          }
          else if (uVar10 < uVar12) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            uVar9 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar7 = (int)uVar10 + (int)uVar9;
              }
              else {
                sVar7 = psVar2[uVar10 + uVar9];
              }
              if ((uVar14 >> (uVar9 & 0x3f) & 1) == 0) {
                uVar11 = 1;
              }
              else {
                uVar11 = (ulong)(ldata[uVar10 + uVar9] != *rdata);
              }
              psVar3[lVar8] = sVar7;
              lVar8 = lVar8 + uVar11;
              uVar9 = uVar9 + 1;
            } while ((uVar10 - uVar12) + uVar9 != 0);
            uVar9 = uVar10 + uVar9;
          }
          uVar13 = uVar13 + 1;
          uVar10 = uVar9;
        } while (uVar13 != uVar15 >> 6);
      }
      return count - lVar8;
    }
    if (0x3f < uVar15) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = 0;
      uVar13 = 0;
      uVar10 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar1[uVar13];
        }
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        uVar9 = uVar12;
        if (uVar14 != 0) {
          uVar9 = uVar10;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar10 < uVar12) {
              psVar2 = sel->sel_vector;
              uVar14 = *rdata;
              psVar3 = true_sel->sel_vector;
              do {
                uVar10 = uVar9;
                if (psVar2 != (sel_t *)0x0) {
                  uVar10 = (ulong)psVar2[uVar9];
                }
                uVar4 = ldata[uVar9];
                psVar3[iVar6] = (sel_t)uVar10;
                iVar6 = iVar6 + (uVar4 == uVar14);
                uVar9 = uVar9 + 1;
              } while (uVar12 != uVar9);
            }
          }
          else if (uVar10 < uVar12) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar9 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar7 = (int)uVar10 + (int)uVar9;
              }
              else {
                sVar7 = psVar2[uVar10 + uVar9];
              }
              if ((uVar14 >> (uVar9 & 0x3f) & 1) == 0) {
                uVar11 = 0;
              }
              else {
                uVar11 = (ulong)(ldata[uVar10 + uVar9] == *rdata);
              }
              psVar3[iVar6] = sVar7;
              iVar6 = iVar6 + uVar11;
              uVar9 = uVar9 + 1;
            } while ((uVar10 - uVar12) + uVar9 != 0);
            uVar9 = uVar10 + uVar9;
          }
        }
        uVar13 = uVar13 + 1;
        uVar10 = uVar9;
      } while (uVar13 != uVar15 >> 6);
      return iVar6;
    }
  }
  else if (0x3f < count + 0x3f) {
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    lVar8 = 0;
    uVar10 = 0;
    uVar15 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar14 = 0xffffffffffffffff;
      }
      else {
        uVar14 = puVar1[uVar10];
      }
      uVar13 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar13 = count;
      }
      uVar12 = uVar15;
      if (uVar14 == 0xffffffffffffffff) {
        if (uVar15 < uVar13) {
          psVar2 = sel->sel_vector;
          uVar14 = *rdata;
          psVar3 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          do {
            uVar12 = uVar15;
            if (psVar2 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar2[uVar15];
            }
            uVar4 = ldata[uVar15];
            psVar3[iVar6] = (sel_t)uVar12;
            iVar6 = iVar6 + (uVar4 == uVar14);
            psVar5[lVar8] = (sel_t)uVar12;
            lVar8 = lVar8 + (ulong)(uVar4 != uVar14);
            uVar15 = uVar15 + 1;
            uVar12 = uVar15;
          } while (uVar13 != uVar15);
        }
      }
      else if (uVar14 == 0) {
        uVar12 = uVar13;
        if (uVar15 < uVar13) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            uVar9 = uVar15;
            if (psVar2 != (sel_t *)0x0) {
              uVar9 = (ulong)psVar2[uVar15];
            }
            psVar3[lVar8] = (sel_t)uVar9;
            lVar8 = lVar8 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
      }
      else if (uVar15 < uVar13) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar5 = false_sel->sel_vector;
        uVar12 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar7 = (int)uVar15 + (int)uVar12;
          }
          else {
            sVar7 = psVar2[uVar15 + uVar12];
          }
          if ((uVar14 >> (uVar12 & 0x3f) & 1) == 0) {
            bVar16 = false;
          }
          else {
            bVar16 = ldata[uVar15 + uVar12] == *rdata;
          }
          psVar3[iVar6] = sVar7;
          iVar6 = iVar6 + bVar16;
          psVar5[lVar8] = sVar7;
          lVar8 = lVar8 + (ulong)(bVar16 ^ 1);
          uVar12 = uVar12 + 1;
        } while ((uVar15 - uVar13) + uVar12 != 0);
        uVar12 = uVar15 + uVar12;
      }
      uVar10 = uVar10 + 1;
      uVar15 = uVar12;
    } while (uVar10 != count + 0x3f >> 6);
    return iVar6;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}